

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  void *pvVar1;
  BYTE *pBVar2;
  U64 UVar3;
  U64 UVar4;
  uint uVar5;
  BYTE *pBVar6;
  U64 UVar7;
  ulong local_f8;
  int nbBytes;
  int nbBits;
  int ctz;
  HUF_DEltX2 entry_2;
  int index_2;
  HUF_DEltX2 entry_1;
  int index_1;
  HUF_DEltX2 entry;
  int index;
  size_t oiters;
  size_t iters;
  int symbol;
  int stream;
  BYTE *olimit;
  BYTE *ilimit;
  HUF_DEltX2 *dtable;
  BYTE *oend [4];
  BYTE *op [4];
  BYTE *ip [4];
  U64 bits [4];
  HUF_DecompressFastArgs *args_local;
  
  pvVar1 = args->dt;
  pBVar2 = args->ilimit;
  ip[3] = (BYTE *)args->bits[0];
  UVar3 = args->bits[1];
  UVar4 = args->bits[2];
  bits[2] = args->bits[3];
  op[3] = args->ip[0];
  ip[0] = args->ip[1];
  ip[1] = args->ip[2];
  ip[2] = args->ip[3];
  oend[3] = args->op[0];
  op[0] = args->op[1];
  oend[0] = args->op[2];
  oend[1] = args->op[3];
  oend[2] = args->oend;
  op[1] = oend[0];
  op[2] = oend[1];
  uVar5 = MEM_isLittleEndian();
  if (uVar5 == 0) {
    __assert_fail("MEM_isLittleEndian()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x5cf,
                  "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  uVar5 = MEM_32bits();
  if (uVar5 != 0) {
    __assert_fail("!MEM_32bits()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                  ,0x5d0,
                  "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                 );
  }
  while( true ) {
    for (iters._4_4_ = 0; iters._4_4_ < 4; iters._4_4_ = iters._4_4_ + 1) {
      if (oend[(long)iters._4_4_ + -1] < oend[(long)iters._4_4_ + 3]) {
        __assert_fail("op[stream] <= oend[stream]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x5da,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (op[(long)iters._4_4_ + 3] < pBVar2) {
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x5db,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    oiters = (ulong)((long)op[3] - (long)pBVar2) / 7;
    for (iters._4_4_ = 0; iters._4_4_ < 4; iters._4_4_ = iters._4_4_ + 1) {
      local_f8 = (ulong)((long)oend[(long)iters._4_4_ + -1] - (long)oend[(long)iters._4_4_ + 3]) /
                 10;
      if (oiters < local_f8) {
        local_f8 = oiters;
      }
      oiters = local_f8;
    }
    pBVar6 = op[2] + oiters * 5;
    if (pBVar6 < op[2] + 10) break;
    for (iters._4_4_ = 1; iters._4_4_ < 4; iters._4_4_ = iters._4_4_ + 1) {
      if (op[(long)iters._4_4_ + 3] < op[(long)(iters._4_4_ + -1) + 3]) goto LAB_00e61720;
    }
    for (iters._4_4_ = 1; iters._4_4_ < 4; iters._4_4_ = iters._4_4_ + 1) {
      if (op[(long)iters._4_4_ + 3] < op[(long)(iters._4_4_ + -1) + 3]) {
        __assert_fail("ip[stream] >= ip[stream - 1]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/huf_decompress.c"
                      ,0x60a,
                      "void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
    }
    do {
      for (iters._0_4_ = 0; (int)iters < 5; iters._0_4_ = (int)iters + 1) {
        for (iters._4_4_ = 0; iters._4_4_ < 3; iters._4_4_ = iters._4_4_ + 1) {
          uVar5 = *(uint *)((long)pvVar1 +
                           (long)(int)(uint)((ulong)ip[(long)iters._4_4_ + 3] >> 0x35) * 4);
          entry_1.sequence = (U16)uVar5;
          MEM_write16(oend[(long)iters._4_4_ + 3],entry_1.sequence);
          entry_1.nbBits = (BYTE)(uVar5 >> 0x10);
          ip[(long)iters._4_4_ + 3] =
               (BYTE *)((long)ip[(long)iters._4_4_ + 3] << (entry_1.nbBits & 0x3f));
          oend[(long)iters._4_4_ + 3] = oend[(long)iters._4_4_ + 3] + (int)(uVar5 >> 0x18);
        }
      }
      uVar5 = *(uint *)((long)pvVar1 + (long)(int)(uint)(bits[2] >> 0x35) * 4);
      entry_2.sequence = (U16)uVar5;
      MEM_write16(op[2],entry_2.sequence);
      entry_2.nbBits = (BYTE)(uVar5 >> 0x10);
      bits[2] = bits[2] << (entry_2.nbBits & 0x3f);
      op[2] = op[2] + (int)(uVar5 >> 0x18);
      for (iters._4_4_ = 0; iters._4_4_ < 4; iters._4_4_ = iters._4_4_ + 1) {
        uVar5 = *(uint *)((long)pvVar1 + (long)(int)(uint)(bits[2] >> 0x35) * 4);
        nbBits._0_2_ = (U16)uVar5;
        MEM_write16(op[2],(U16)nbBits);
        nbBits._2_1_ = (byte)(uVar5 >> 0x10);
        bits[2] = bits[2] << (nbBits._2_1_ & 0x3f);
        op[2] = op[2] + (int)(uVar5 >> 0x18);
        uVar5 = ZSTD_countTrailingZeros64((U64)ip[(long)iters._4_4_ + 3]);
        op[(long)iters._4_4_ + 3] = op[(long)iters._4_4_ + 3] + -(long)((int)uVar5 >> 3);
        UVar7 = MEM_read64(op[(long)iters._4_4_ + 3]);
        ip[(long)iters._4_4_ + 3] = (BYTE *)(UVar7 | 1);
        ip[(long)iters._4_4_ + 3] = (BYTE *)((long)ip[(long)iters._4_4_ + 3] << ((byte)uVar5 & 7));
      }
    } while (op[2] < pBVar6);
  }
LAB_00e61720:
  args->bits[0] = (U64)ip[3];
  args->bits[1] = UVar3;
  args->bits[2] = UVar4;
  args->bits[3] = bits[2];
  args->ip[0] = op[3];
  args->ip[1] = ip[0];
  args->ip[2] = ip[1];
  args->ip[3] = ip[2];
  args->op[0] = oend[3];
  args->op[1] = op[0];
  args->op[2] = op[1];
  args->op[3] = op[2];
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilimit) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop if we are too close to the end. */
            if (op[3] + 10 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Do 5 table lookups for each of the first 3 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 3; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[stream], entry.sequence);
                    bits[stream] <<= (entry.nbBits);
                    op[stream] += (entry.length);
                }
            }
            /* Do 1 table lookup from the final stream */
            {
                int const index = (int)(bits[3] >> 53);
                HUF_DEltX2 const entry = dtable[index];
                MEM_write16(op[3], entry.sequence);
                bits[3] <<= (entry.nbBits);
                op[3] += (entry.length);
            }
            /* Do 4 table lookups from the final stream & reload bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                /* Do a table lookup from the final stream.
                 * This is interleaved with the reloading to reduce register
                 * pressure. This shouldn't be necessary, but compilers can
                 * struggle with codegen with high register pressure.
                 */
                {
                    int const index = (int)(bits[3] >> 53);
                    HUF_DEltX2 const entry = dtable[index];
                    MEM_write16(op[3], entry.sequence);
                    bits[3] <<= (entry.nbBits);
                    op[3] += (entry.length);
                }
                /* Reload the bistreams. The final bitstream must be reloaded
                 * after the 5th symbol was decoded.
                 */
                {
                    int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                    int const nbBits = ctz & 7;
                    int const nbBytes = ctz >> 3;
                    ip[stream] -= nbBytes;
                    bits[stream] = MEM_read64(ip[stream]) | 1;
                    bits[stream] <<= nbBits;
                }
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}